

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall wasm::LocalScanner::visitLocalSet(LocalScanner *this,LocalSet *curr)

{
  Id IVar1;
  Index IVar2;
  Module *module;
  PassOptions *passOptions;
  long lVar3;
  BinaryOp BVar4;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> pBVar5;
  bool bVar6;
  Index IVar7;
  uint uVar8;
  Type TVar9;
  Expression **ppEVar10;
  Expression *pEVar11;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> candidate;
  ulong uVar12;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_130;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_f0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_c8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_b8;
  undefined8 local_78;
  undefined4 local_70;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_68;
  Expression *local_50;
  Expression *extended;
  LocalSet *local_40;
  int local_38;
  int local_34;
  int32_t leftShift;
  int32_t rightShift;
  
  bVar6 = Function::isParam((this->
                            super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                            ).
                            super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                            .currFunction,curr->index);
  if (bVar6) {
    return;
  }
  TVar9 = Function::getLocalType
                    ((this->
                     super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>)
                     .super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                     currFunction,curr->index);
  if ((TVar9.id & 0xfffffffffffffffe) != 2) {
    return;
  }
  module = (this->super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>).
           super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.currModule;
  passOptions = this->passOptions;
  pBVar5 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
           curr->value;
  extended = (Expression *)this;
  local_40 = curr;
  do {
    candidate = pBVar5;
    local_b8.binder = (matched_t<wasm::Const_*> *)candidate;
    ppEVar10 = Properties::getImmediateFallthroughPtr
                         ((Expression **)&local_b8,passOptions,module,AllowTeeBrIf);
    pBVar5 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
             *ppEVar10;
  } while ((matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
           *ppEVar10 != candidate);
  uVar12 = (ulong)local_40->index;
  lVar3 = *(long *)extended[0xd].type.id;
  IVar7 = Bits::getMaxBits<wasm::LocalScanner>((Expression *)candidate,(LocalScanner *)extended);
  uVar8 = *(uint *)(lVar3 + uVar12 * 8);
  pEVar11 = (Expression *)(ulong)uVar8;
  if (IVar7 < uVar8) {
    IVar7 = uVar8;
  }
  *(Index *)(lVar3 + uVar12 * 8) = IVar7;
  if ((candidate->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id == 2)
  {
    IVar1 = (candidate->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id;
    if (IVar1 == UnaryId) {
      if (candidate->op - GtUInt64 < 2) {
        pEVar11 = candidate->left;
      }
      else {
        pEVar11 = (Expression *)0x0;
      }
    }
    if (IVar1 == UnaryId) goto LAB_009f9c2c;
    local_b8.submatchers.curr.submatchers.curr.binder = &local_38;
    local_38 = 0;
    local_130.submatchers.curr.submatchers.curr.binder = &local_34;
    local_34 = 0;
    local_c8.binder = &local_50;
    local_50 = (Expression *)0x0;
    local_f0.submatchers.curr = &local_c8;
    local_b8.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_b8.binder = (matched_t<wasm::Const_*> *)0x0;
    local_68.curr = &local_f0;
    local_f0.binder =
         (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0;
    local_f0.data = ShlInt32;
    local_68.next.curr = &local_130;
    local_130.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_130.binder = (matched_t<wasm::Const_*> *)0x0;
    local_78 = 0;
    local_70 = 0xb;
    local_f0.submatchers.next.curr = &local_b8;
    if ((((IVar1 == BinaryId) && (candidate->op == ShrSInt32)) &&
        (bVar6 = Match::Internal::
                 Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
                 ::match(candidate,&local_68), bVar6)) &&
       ((local_38 == local_34 && (pEVar11 = local_50, local_38 != 0)))) goto LAB_009f9c2c;
  }
  pEVar11 = (Expression *)0x0;
LAB_009f9c2c:
  if (pEVar11 == (Expression *)0x0) {
    IVar7 = 0xffffffff;
    if (((((candidate->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
           LoadId) &&
         ((local_b8.binder =
                (matched_t<wasm::Const_*> *)
                (candidate->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
                type.id, (matched_t<wasm::Const_*> *)0x5 < local_b8.binder ||
          ((0x32UL >> ((ulong)local_b8.binder & 0x3f) & 1) == 0)))) &&
        (BVar4 = candidate->op, uVar8 = wasm::Type::getByteSize((Type *)&local_b8),
        (byte)(char)BVar4 < uVar8)) && (*(byte *)((long)&candidate->op + 1) == 1)) {
      IVar7 = (uint)(byte)(char)candidate->op << 3;
    }
  }
  else {
    IVar7 = Properties::getSignExtBits((Expression *)candidate);
  }
  IVar2 = *(Index *)(lVar3 + 4 + uVar12 * 8);
  if ((IVar2 == 0) || (bVar6 = IVar2 != IVar7, IVar7 = 0xffffffff, bVar6)) {
    *(Index *)(lVar3 + 4 + uVar12 * 8) = IVar7;
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    auto* func = getFunction();
    if (func->isParam(curr->index)) {
      return;
    }
    auto type = getFunction()->getLocalType(curr->index);
    if (type != Type::i32 && type != Type::i64) {
      return;
    }
    // an integer var, worth processing
    auto* value =
      Properties::getFallthrough(curr->value, passOptions, *getModule());
    auto& info = localInfo[curr->index];
    info.maxBits = std::max(info.maxBits, Bits::getMaxBits(value, this));
    auto signExtBits = LocalInfo::kUnknown;
    if (Properties::getSignExtValue(value)) {
      signExtBits = Properties::getSignExtBits(value);
    } else if (auto* load = value->dynCast<Load>()) {
      if (LoadUtils::isSignRelevant(load) && load->signed_) {
        signExtBits = load->bytes * 8;
      }
    }
    if (info.signExtBits == 0) {
      info.signExtBits = signExtBits; // first info we see
    } else if (info.signExtBits != signExtBits) {
      // contradictory information, give up
      info.signExtBits = LocalInfo::kUnknown;
    }
  }